

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetPHRQHandle(ndicapi *pol)

{
  char cVar1;
  uint uVar2;
  int i;
  long lVar3;
  int iVar4;
  
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    cVar1 = pol->PhrqReply[lVar3];
    iVar4 = -0x57;
    if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar4 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar4 = -0x30, 9 < (byte)(cVar1 - 0x30U))) break;
    uVar2 = uVar2 << 4 | iVar4 + cVar1;
    lVar3 = lVar3 + 1;
    if (lVar3 == 2) {
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

ndicapiExport int ndiGetPHRQHandle(ndicapi* pol)
{
  char* dp;

  dp = pol->PhrqReply;
  return (int)ndiHexToUnsignedLong(dp, 2);
}